

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Track.cpp
# Opt level: O0

Track * __thiscall Track::format(Track *this,CylHead *cylhead,Format *fmt)

{
  bool bVar1;
  int iVar2;
  reference piVar3;
  int local_e8;
  allocator<unsigned_char> local_d1;
  undefined1 local_d0 [8];
  Data data;
  Sector sector;
  undefined1 local_64 [8];
  Header header;
  int id;
  iterator __end1;
  iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  Format *fmt_local;
  CylHead *cylhead_local;
  Track *this_local;
  
  if (fmt->sectors != 0) {
    std::vector<Sector,_std::allocator<Sector>_>::clear(&this->m_sectors);
    std::vector<Sector,_std::allocator<Sector>_>::reserve(&this->m_sectors,(long)fmt->sectors);
    Format::get_ids((vector<int,_std::allocator<int>_> *)&__begin1,fmt,cylhead);
    __end1 = std::vector<int,_std::allocator<int>_>::begin
                       ((vector<int,_std::allocator<int>_> *)&__begin1);
    register0x00000000 =
         std::vector<int,_std::allocator<int>_>::end((vector<int,_std::allocator<int>_> *)&__begin1)
    ;
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end1,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                  *)&header.size);
      if (!bVar1) break;
      piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&__end1);
      header.sector = *piVar3;
      if (cylhead->head == 0) {
        local_e8 = fmt->head0;
      }
      else {
        local_e8 = fmt->head1;
      }
      Header::Header((Header *)local_64,cylhead->cyl,local_e8,header.sector,fmt->size);
      Sector::Sector((Sector *)
                     &data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,fmt->datarate,fmt->encoding,
                     (Header *)local_64,fmt->gap3);
      iVar2 = Format::sector_size(fmt);
      std::allocator<unsigned_char>::allocator(&local_d1);
      Data::vector((Data *)local_d0,(long)iVar2,&fmt->fill,&local_d1);
      std::allocator<unsigned_char>::~allocator(&local_d1);
      Sector::add((Sector *)
                  &data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage,(Data *)local_d0,false,0xfb);
      add(this,(Sector *)
               &data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
      Data::~Data((Data *)local_d0);
      Sector::~Sector((Sector *)
                      &data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&__end1);
    }
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&__begin1);
    return this;
  }
  __assert_fail("fmt.sectors != 0",
                "/workspace/llm4binary/github/license_c_cmakelists/simonowen[P]samdisk/src/Track.cpp"
                ,0xf9,"Track &Track::format(const CylHead &, const Format &)");
}

Assistant:

Track& Track::format(const CylHead& cylhead, const Format& fmt)
{
    assert(fmt.sectors != 0);

    m_sectors.clear();
    m_sectors.reserve(fmt.sectors);

    for (auto id : fmt.get_ids(cylhead))
    {
        Header header(cylhead.cyl, cylhead.head ? fmt.head1 : fmt.head0, id, fmt.size);
        Sector sector(fmt.datarate, fmt.encoding, header, fmt.gap3);
        Data data(fmt.sector_size(), fmt.fill);

        sector.add(std::move(data));
        add(std::move(sector));
    }

    return *this;
}